

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

bool __thiscall Arc::operator<(Arc *this,Arc *o)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = this->u;
  iVar2 = o->u;
  bVar3 = true;
  if (iVar2 <= iVar1) {
    if (iVar1 == iVar2) {
      bVar3 = this->v < o->v;
      if (iVar1 != iVar2 || bVar3) {
        return bVar3;
      }
      if (this->v == o->v) {
        return this->label < o->label;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Arc::operator<(const Arc &o) const {
	return (u < o.u) ||
		   (u == o.u && v < o.v) ||
		   (u == o.u && v == o.v && label < o.label);
}